

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_CCtx * ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  ZSTD_cwksp *ws_00;
  ZSTD_compressedBlockState_t *pZVar1;
  U32 *pUVar2;
  uint *puVar3;
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  ZSTD_compressedBlockState_t *pZVar8;
  U32 *pUVar9;
  ZSTD_cwksp ws;
  undefined1 local_68 [16];
  void *pvStack_58;
  void *pvStack_50;
  undefined1 local_48 [16];
  undefined4 uStack_38;
  int iStack_34;
  ZSTD_cwksp_alloc_phase_e ZStack_30;
  undefined4 uStack_2c;
  
  auVar5 = _local_48;
  if (((ulong)workspace & 7) == 0 && 0x488 < workspaceSize) {
    local_68._8_8_ = (long)workspace + workspaceSize;
    local_68._0_8_ = workspace;
    pvStack_58 = workspace;
    local_48._0_8_ = workspace;
    auVar6 = _local_48;
    uStack_2c = auVar5._28_4_;
    _local_48 = auVar6._0_24_;
    ZStack_30 = 0;
    auVar5 = _local_48;
    pvStack_50 = workspace;
    local_48._8_8_ = (long)workspace + workspaceSize;
    _iStack_34 = auVar5._20_12_;
    uStack_38 = 0;
    ZSTD_cwksp_assert_internal_consistency((ZSTD_cwksp *)local_68);
    iStack_34 = 0;
    ZSTD_cwksp_assert_internal_consistency((ZSTD_cwksp *)local_68);
    ZSTD_cwksp_assert_internal_consistency((ZSTD_cwksp *)local_68);
    if ((long)workspaceSize < 0x488) {
      uStack_38 = 1;
      workspace = (ZSTD_CCtx *)0x0;
    }
    else {
      lVar4 = (long)workspace + 0x488;
      pvStack_58 = (void *)lVar4;
      pvStack_50 = (void *)lVar4;
      local_48._0_8_ = lVar4;
    }
    if ((ZSTD_CCtx *)workspace != (ZSTD_CCtx *)0x0) {
      memset(workspace,0,0x488);
      (((ZSTD_CCtx *)workspace)->workspace).workspace = (void *)local_68._0_8_;
      (((ZSTD_CCtx *)workspace)->workspace).workspaceEnd = (void *)local_68._8_8_;
      (((ZSTD_CCtx *)workspace)->workspace).objectEnd = pvStack_58;
      (((ZSTD_CCtx *)workspace)->workspace).tableEnd = pvStack_50;
      (((ZSTD_CCtx *)workspace)->workspace).tableValidEnd = (void *)local_48._0_8_;
      (((ZSTD_CCtx *)workspace)->workspace).allocStart = (void *)local_48._8_8_;
      (((ZSTD_CCtx *)workspace)->workspace).allocFailed = uStack_38;
      (((ZSTD_CCtx *)workspace)->workspace).workspaceOversizedDuration = iStack_34;
      (((ZSTD_CCtx *)workspace)->workspace).phase = ZStack_30;
      *(undefined4 *)&(((ZSTD_CCtx *)workspace)->workspace).field_0x3c = uStack_2c;
      _local_68 = ZEXT832(0) << 0x20;
      ((ZSTD_CCtx *)workspace)->staticSize = workspaceSize;
      if (0x3bdf < (ulong)((long)(((ZSTD_CCtx *)workspace)->workspace).allocStart -
                          (long)(((ZSTD_CCtx *)workspace)->workspace).tableEnd)) {
        pZVar8 = (ZSTD_compressedBlockState_t *)(((ZSTD_CCtx *)workspace)->workspace).objectEnd;
        _local_48 = _local_68;
        if (((ulong)pZVar8 & 7) == 0) {
          ws_00 = &((ZSTD_CCtx *)workspace)->workspace;
          ZSTD_cwksp_assert_internal_consistency(ws_00);
          if (((((ZSTD_CCtx *)workspace)->workspace).phase == ZSTD_cwksp_alloc_objects) &&
             (pZVar1 = pZVar8 + 1,
             pZVar1 <= (ZSTD_compressedBlockState_t *)
                       (((ZSTD_CCtx *)workspace)->workspace).workspaceEnd)) {
            (((ZSTD_CCtx *)workspace)->workspace).objectEnd = pZVar1;
            (((ZSTD_CCtx *)workspace)->workspace).tableEnd = pZVar1;
            (((ZSTD_CCtx *)workspace)->workspace).tableValidEnd = pZVar1;
          }
          else {
            (((ZSTD_CCtx *)workspace)->workspace).allocFailed = 1;
            pZVar8 = (ZSTD_compressedBlockState_t *)0x0;
          }
          (((ZSTD_CCtx *)workspace)->blockState).prevCBlock = pZVar8;
          pZVar8 = (ZSTD_compressedBlockState_t *)(((ZSTD_CCtx *)workspace)->workspace).objectEnd;
          if (((ulong)pZVar8 & 7) == 0) {
            ZSTD_cwksp_assert_internal_consistency(ws_00);
            if (((((ZSTD_CCtx *)workspace)->workspace).phase == ZSTD_cwksp_alloc_objects) &&
               (pZVar1 = pZVar8 + 1,
               pZVar1 <= (ZSTD_compressedBlockState_t *)
                         (((ZSTD_CCtx *)workspace)->workspace).workspaceEnd)) {
              (((ZSTD_CCtx *)workspace)->workspace).objectEnd = pZVar1;
              (((ZSTD_CCtx *)workspace)->workspace).tableEnd = pZVar1;
              (((ZSTD_CCtx *)workspace)->workspace).tableValidEnd = pZVar1;
            }
            else {
              (((ZSTD_CCtx *)workspace)->workspace).allocFailed = 1;
              pZVar8 = (ZSTD_compressedBlockState_t *)0x0;
            }
            (((ZSTD_CCtx *)workspace)->blockState).nextCBlock = pZVar8;
            pUVar9 = (U32 *)(((ZSTD_CCtx *)workspace)->workspace).objectEnd;
            if (((ulong)pUVar9 & 7) == 0) {
              ZSTD_cwksp_assert_internal_consistency(ws_00);
              if (((((ZSTD_CCtx *)workspace)->workspace).phase == ZSTD_cwksp_alloc_objects) &&
                 (pUVar2 = pUVar9 + 0x600,
                 pUVar2 <= (((ZSTD_CCtx *)workspace)->workspace).workspaceEnd)) {
                (((ZSTD_CCtx *)workspace)->workspace).objectEnd = pUVar2;
                (((ZSTD_CCtx *)workspace)->workspace).tableEnd = pUVar2;
                (((ZSTD_CCtx *)workspace)->workspace).tableValidEnd = pUVar2;
              }
              else {
                (((ZSTD_CCtx *)workspace)->workspace).allocFailed = 1;
                pUVar9 = (U32 *)0x0;
              }
              ((ZSTD_CCtx *)workspace)->entropyWorkspace = pUVar9;
              uVar7 = 0;
              puVar3 = (uint *)cpuid_basic_info(0);
              if (6 < *puVar3) {
                lVar4 = cpuid_Extended_Feature_Enumeration_info(7);
                uVar7 = *(uint *)(lVar4 + 4) >> 8 & 1;
              }
              ((ZSTD_CCtx *)workspace)->bmi2 = uVar7;
              return (ZSTD_CCtx *)workspace;
            }
          }
        }
        __assert_fail("((size_t)alloc & (sizeof(void*)-1)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1d30,"void *ZSTD_cwksp_reserve_object(ZSTD_cwksp *, size_t)");
      }
    }
  }
  return (ZSTD_CCtx *)0x0;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void *workspace, size_t workspaceSize)
{
    ZSTD_cwksp ws;
    ZSTD_CCtx* cctx;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    ZSTD_cwksp_init(&ws, workspace, workspaceSize);

    cctx = (ZSTD_CCtx*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CCtx));
    if (cctx == NULL) {
        return NULL;
    }
    memset(cctx, 0, sizeof(ZSTD_CCtx));
    ZSTD_cwksp_move(&cctx->workspace, &ws);
    cctx->staticSize = workspaceSize;

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (!ZSTD_cwksp_check_available(&cctx->workspace, HUF_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t))) return NULL;
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->blockState.nextCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(
        &cctx->workspace, HUF_WORKSPACE_SIZE);
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}